

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

void __thiscall
google::
sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::erase(sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *this,iterator pos)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_60;
  
  local_60.pos.row_begin._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_60.pos.row_end._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_60.pos.col_current = (nonempty_iterator)0x0;
  local_60.end.col_current = (nonempty_iterator)0x0;
  local_60.ht = this;
  local_60.pos.row_current._M_current = local_60.pos.row_end._M_current;
  local_60.end.row_begin._M_current = local_60.pos.row_begin._M_current;
  local_60.end.row_end._M_current = local_60.pos.row_end._M_current;
  local_60.end.row_current._M_current = local_60.pos.row_end._M_current;
  sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_60);
  if ((((pos.pos.row_begin._M_current != local_60.pos.row_begin._M_current) ||
       (pos.pos.row_end._M_current != local_60.pos.row_end._M_current)) ||
      (pos.pos.row_current._M_current != local_60.pos.row_current._M_current)) ||
     ((pos.pos.row_current._M_current != pos.pos.row_end._M_current &&
      (pos.pos.col_current != local_60.pos.col_current)))) {
    sVar4 = this->num_deleted;
    if (sVar4 == 0) {
      *pos.pos.col_current = -(this->key_info).delkey;
    }
    else {
      iVar2 = (this->key_info).delkey;
      iVar3 = *pos.pos.col_current;
      piVar1 = &(this->key_info).super_TransparentHasher.super_Hasher.num_compares_;
      *piVar1 = *piVar1 + 1;
      *pos.pos.col_current = -iVar2;
      if (iVar3 + iVar2 == 0) {
        return;
      }
    }
    this->num_deleted = sVar4 + 1;
    (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    consider_shrink_ = true;
  }
  return;
}

Assistant:

void erase(iterator pos) {
    if (pos == end()) return;  // sanity check
    if (set_deleted(pos)) {    // true if object has been newly deleted
      ++num_deleted;
      // will think about shrink after next insert
      settings.set_consider_shrink(true);
    }
  }